

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O1

void eddsa_sign(ssh_key *key,ptrlen data,uint flags,BinarySink *bs)

{
  eddsa_key *ek;
  ecsign_extra *extra;
  BinarySink *pBVar1;
  ptrlen r_encoded;
  uint8_t uVar2;
  ssh_hash *psVar3;
  mp_int *y;
  mp_int *pmVar4;
  mp_int *n;
  EdwardsPoint *point;
  strbuf *buf_o;
  mp_int *y_00;
  mp_int *x;
  _func_char_ptr_ssh_key_ptr_uint *p_Var5;
  size_t byte;
  ptrlen hash_00;
  ptrlen bytes;
  uchar hash [114];
  uchar local_a8 [120];
  
  if (key[-1].vt != (ssh_keyalg *)0x0) {
    ek = (eddsa_key *)(key + -3);
    extra = (ecsign_extra *)key->vt->extra;
    psVar3 = (*extra->hash->new)(extra->hash);
    if (psVar3 != (ssh_hash *)0x0) {
      (*psVar3->vt->reset)(psVar3);
    }
    if (ek->curve->fieldBytes != 0) {
      p_Var5 = (_func_char_ptr_ssh_key_ptr_uint *)0x0;
      do {
        pBVar1 = psVar3->binarysink_;
        uVar2 = mp_get_byte((mp_int *)key[-1].vt,(size_t)p_Var5);
        BinarySink_put_byte(pBVar1,uVar2);
        p_Var5 = p_Var5 + 1;
      } while (p_Var5 < (key[-3].vt)->invalid);
    }
    (*psVar3->vt->digest)(psVar3,local_a8);
    (*psVar3->vt->free)(psVar3);
    hash_00.len = ek->curve->fieldBytes;
    hash_00.ptr = local_a8;
    y = eddsa_exponent_from_hash(hash_00,ek->curve);
    psVar3 = (*extra->hash->new)(extra->hash);
    if (psVar3 != (ssh_hash *)0x0) {
      (*psVar3->vt->reset)(psVar3);
    }
    BinarySink_put_datapl(psVar3->binarysink_,extra->hash_prefix);
    p_Var5 = (key[-3].vt)->invalid;
    BinarySink_put_data(psVar3->binarysink_,local_a8 + (long)p_Var5,extra->hash->hlen - (long)p_Var5
                       );
    BinarySink_put_datapl(psVar3->binarysink_,data);
    (*psVar3->vt->digest)(psVar3,local_a8);
    (*psVar3->vt->free)(psVar3);
    bytes.len = extra->hash->hlen;
    bytes.ptr = local_a8;
    pmVar4 = mp_from_bytes_le(bytes);
    n = mp_mod(pmVar4,(mp_int *)(key[-3].vt)->private_blob);
    mp_free(pmVar4);
    point = ecc_edwards_multiply((EdwardsPoint *)(key[-3].vt)->public_blob,n);
    buf_o = strbuf_new();
    BinarySink_put_epoint(buf_o->binarysink_,point,(ec_curve *)key[-3].vt,true);
    ecc_edwards_point_free(point);
    r_encoded.ptr = buf_o->u;
    r_encoded.len = buf_o->len;
    pmVar4 = eddsa_signing_exponent_from_data(ek,extra,r_encoded,data);
    y_00 = mp_modmul(pmVar4,y,(mp_int *)(key[-3].vt)->private_blob);
    x = mp_modadd(n,y_00,(mp_int *)(key[-3].vt)->private_blob);
    mp_free(pmVar4);
    mp_free(y);
    mp_free(y_00);
    mp_free(n);
    BinarySink_put_stringz(bs->binarysink_,key->vt->ssh_id);
    BinarySink_put_uint32(bs->binarysink_,(unsigned_long)((key[-3].vt)->invalid + buf_o->len));
    BinarySink_put_data(bs->binarysink_,buf_o->u,buf_o->len);
    strbuf_free(buf_o);
    if ((key[-3].vt)->invalid != (_func_char_ptr_ssh_key_ptr_uint *)0x0) {
      byte = 0;
      do {
        pBVar1 = bs->binarysink_;
        uVar2 = mp_get_byte(x,byte);
        BinarySink_put_byte(pBVar1,uVar2);
        byte = byte + 1;
      } while (byte < ek->curve->fieldBytes);
    }
    mp_free(x);
    return;
  }
  __assert_fail("ek->privateKey",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x497,"void eddsa_sign(ssh_key *, ptrlen, unsigned int, BinarySink *)");
}

Assistant:

static void eddsa_sign(ssh_key *key, ptrlen data,
                       unsigned flags, BinarySink *bs)
{
    struct eddsa_key *ek = container_of(key, struct eddsa_key, sshk);
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)ek->sshk.vt->extra;
    assert(ek->privateKey);

    /*
     * EdDSA prescribes a specific method of generating the random
     * nonce integer for the signature. (A verifier can't tell
     * whether you followed that method, but it's important to
     * follow it anyway, because test vectors will want a specific
     * signature for a given message, and because this preserves
     * determinism of signatures even if the same signature were
     * made twice by different software.)
     */

    /*
     * First, we hash the private key integer (bare, little-endian)
     * into a hash generating 2*fieldBytes of output.
     */
    unsigned char hash[MAX_HASH_LEN];
    ssh_hash *h = ssh_hash_new(extra->hash);
    for (size_t i = 0; i < ek->curve->fieldBytes; ++i)
        put_byte(h, mp_get_byte(ek->privateKey, i));
    ssh_hash_final(h, hash);

    /*
     * The first half of the output hash is converted into an
     * integer a, by the standard EdDSA transformation.
     */
    mp_int *a = eddsa_exponent_from_hash(
        make_ptrlen(hash, ek->curve->fieldBytes), ek->curve);

    /*
     * The second half of the hash of the private key is hashed again
     * with the message to be signed, and used as an exponent to
     * generate the signature point r.
     */
    h = ssh_hash_new(extra->hash);
    put_datapl(h, extra->hash_prefix);
    put_data(h, hash + ek->curve->fieldBytes,
             extra->hash->hlen - ek->curve->fieldBytes);
    put_datapl(h, data);
    ssh_hash_final(h, hash);
    mp_int *log_r_unreduced = mp_from_bytes_le(
        make_ptrlen(hash, extra->hash->hlen));
    mp_int *log_r = mp_mod(log_r_unreduced, ek->curve->e.G_order);
    mp_free(log_r_unreduced);
    EdwardsPoint *r = ecc_edwards_multiply(ek->curve->e.G, log_r);

    /*
     * Encode r now, because we'll need its encoding for the next
     * hashing step as well as to write into the actual signature.
     */
    strbuf *r_enc = strbuf_new();
    put_epoint(r_enc, r, ek->curve, true); /* omit string header */
    ecc_edwards_point_free(r);

    /*
     * Compute the hash of (r || public key || message) just as
     * eddsa_verify does.
     */
    mp_int *H = eddsa_signing_exponent_from_data(
        ek, extra, ptrlen_from_strbuf(r_enc), data);

    /* And then s = (log(r) + H*a) mod order(G). */
    mp_int *Ha = mp_modmul(H, a, ek->curve->e.G_order);
    mp_int *s = mp_modadd(log_r, Ha, ek->curve->e.G_order);
    mp_free(H);
    mp_free(a);
    mp_free(Ha);
    mp_free(log_r);

    /* Format the output */
    put_stringz(bs, ek->sshk.vt->ssh_id);
    put_uint32(bs, r_enc->len + ek->curve->fieldBytes);
    put_data(bs, r_enc->u, r_enc->len);
    strbuf_free(r_enc);
    for (size_t i = 0; i < ek->curve->fieldBytes; ++i)
        put_byte(bs, mp_get_byte(s, i));
    mp_free(s);
}